

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall cs_impl::any::constant(any *this)

{
  proxy *ppVar1;
  error *this_00;
  string local_38;
  
  ppVar1 = this->mDat;
  if (ppVar1 != (proxy *)0x0) {
    if (2 < ppVar1->protect_level) {
      this_00 = (error *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000G","");
      cov::error::error(this_00,&local_38);
      __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
    }
    ppVar1->protect_level = 2;
  }
  return;
}

Assistant:

void constant()
		{
			if (this->mDat != nullptr) {
				if (this->mDat->protect_level > 2)
					throw cov::error("E000G");
				this->mDat->protect_level = 2;
			}
		}